

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O2

void quicly_ranges_drop_by_range_indices
               (quicly_ranges_t *ranges,size_t begin_range_index,size_t end_range_index)

{
  ulong uVar1;
  long lVar2;
  quicly_range_t *pqVar3;
  size_t sVar4;
  long lVar5;
  
  lVar5 = begin_range_index - end_range_index;
  if (begin_range_index < end_range_index) {
    lVar2 = ranges->num_ranges - end_range_index;
    if (lVar2 != 0) {
      memmove(ranges->ranges + begin_range_index,ranges->ranges + end_range_index,lVar2 * 0x10);
      end_range_index = ranges->num_ranges;
    }
    sVar4 = end_range_index + lVar5;
    ranges->num_ranges = sVar4;
    uVar1 = ranges->capacity;
    if ((4 < uVar1) && (sVar4 * 3 <= uVar1)) {
      pqVar3 = (quicly_range_t *)realloc(ranges->ranges,(uVar1 >> 1) << 4);
      if (pqVar3 != (quicly_range_t *)0x0) {
        ranges->ranges = pqVar3;
        ranges->capacity = uVar1 >> 1;
      }
    }
    return;
  }
  __assert_fail("begin_range_index < end_range_index",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/ranges.c"
                ,0x41,"void quicly_ranges_drop_by_range_indices(quicly_ranges_t *, size_t, size_t)")
  ;
}

Assistant:

void quicly_ranges_drop_by_range_indices(quicly_ranges_t *ranges, size_t begin_range_index, size_t end_range_index)
{
    assert(begin_range_index < end_range_index);

    MOVE(ranges->ranges + begin_range_index, ranges->ranges + end_range_index, ranges->num_ranges - end_range_index);
    ranges->num_ranges -= end_range_index - begin_range_index;
    if (ranges->capacity > 4 && ranges->num_ranges * 3 <= ranges->capacity) {
        size_t new_capacity = ranges->capacity / 2;
        quicly_range_t *new_ranges = realloc(ranges->ranges, new_capacity * sizeof(*new_ranges));
        if (new_ranges != NULL) {
            ranges->ranges = new_ranges;
            ranges->capacity = new_capacity;
        }
    }
}